

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

int __thiscall crnlib::symbol_codec::decode_remove_byte_from_bit_buf(symbol_codec *this)

{
  int result;
  symbol_codec *this_local;
  
  if (this->m_bit_count < 8) {
    this_local._4_4_ = 0xffffffff;
  }
  else {
    this_local._4_4_ = this->m_bit_buf >> 0x18;
    this->m_bit_buf = this->m_bit_buf << 8;
    this->m_bit_count = this->m_bit_count + -8;
  }
  return this_local._4_4_;
}

Assistant:

int symbol_codec::decode_remove_byte_from_bit_buf()
    {
        if (m_bit_count < 8)
        {
            return -1;
        }
        int result = static_cast<int>(m_bit_buf >> (cBitBufSize - 8));
        m_bit_buf <<= 8;
        m_bit_count -= 8;
        return result;
    }